

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_script_arg(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *__return_storage_ptr__,string *arg,string *fname,string *err)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  istream *piVar10;
  size_type sVar11;
  reference pvVar12;
  ulong uVar13;
  double dVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e98 [32];
  string local_e78 [8];
  string val_2;
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [8];
  string line_2;
  istream local_d90 [4];
  int lineNum_2;
  ifstream file_2;
  string local_b88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28 [32];
  int local_b08;
  byte local_b01;
  int i_2;
  bool valid_var_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0 [32];
  string local_aa0 [8];
  string val_1;
  __cxx11 local_a80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  __cxx11 local_980 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0 [36];
  int local_8bc;
  string local_8b8 [4];
  int semi;
  int local_894;
  string local_890 [4];
  int iret;
  string local_870 [32];
  string local_850 [8];
  string line_1;
  int local_82c;
  istream local_828 [3];
  bool in_func_body;
  int lineNum_1;
  ifstream file_1;
  string local_620 [32];
  string local_600 [8];
  string funcdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0 [32];
  string local_580 [32];
  string local_560 [8];
  string params;
  int close_1;
  int open_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8 [36];
  int local_4d4;
  string local_4d0 [4];
  int i_1;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [8];
  string element;
  string local_448 [7];
  bool hasQuote;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [8];
  string line;
  istream local_360 [3];
  bool in_array;
  int lineNum;
  ifstream file;
  undefined1 local_158 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arr;
  string def;
  int local_11c;
  int local_118;
  int i;
  int idx;
  bool isNumber;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  string local_b0 [32];
  string local_90 [8];
  string index;
  int close;
  int open;
  string val;
  string *err_local;
  string *fname_local;
  string *arg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  bVar1 = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)arg);
  if (*pcVar7 == '\"') {
    readQuote((string *)&open);
    lVar8 = std::__cxx11::string::length();
    if (lVar8 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&open);
    }
    bVar1 = true;
    std::__cxx11::string::~string((string *)&open);
    goto LAB_00151f5d;
  }
  lVar8 = std::__cxx11::string::find((char *)arg,0x15b415);
  if (lVar8 == -1) {
    lVar8 = std::__cxx11::string::find((char *)arg,0x15c078);
    if ((lVar8 != -1) && (lVar8 = std::__cxx11::string::find((char *)arg,0x15bd4e), lVar8 != -1)) {
      iVar5 = std::__cxx11::string::find((char *)arg,0x15c078);
      iVar6 = std::__cxx11::string::find((char *)arg,0x15bd4e);
      std::__cxx11::string::substr((ulong)local_580,(ulong)arg);
      trimSpaces(local_560);
      std::__cxx11::string::~string(local_580);
      if ((iVar6 == iVar5 + 1) || (lVar8 = std::__cxx11::string::length(), lVar8 == 0)) {
        std::__cxx11::string::find((char *)arg,0x15c078);
        std::__cxx11::string::substr((ulong)local_620,(ulong)arg);
        std::operator+((char *)local_600,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "string ");
        std::__cxx11::string::~string(local_620);
        std::ifstream::ifstream(local_828,(string *)fname,_S_in);
        bVar2 = std::ifstream::is_open();
        if ((bVar2 & 1) == 0) {
LAB_0015169b:
          std::ifstream::close();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2,
                         (char *)err);
          std::operator+(local_ae0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2);
          dVar14 = (double)std::operator+(local_ac0,(char *)local_ae0);
          log(dVar14);
          std::__cxx11::string::~string((string *)local_ac0);
          std::__cxx11::string::~string((string *)local_ae0);
          std::__cxx11::string::~string((string *)&i_2);
          bVar1 = true;
        }
        else {
          local_82c = 0;
          bVar4 = false;
          std::__cxx11::string::string(local_850);
          do {
            do {
              piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  (local_828,local_850);
              bVar3 = std::ios::operator_cast_to_bool
                                ((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
              if (!bVar3) goto LAB_00151668;
              local_82c = local_82c + 1;
              std::__cxx11::string::string(local_890,local_850);
              trimSpaces(local_870);
              std::__cxx11::string::operator=(local_850,(string *)local_870);
              std::__cxx11::string::~string((string *)local_870);
              std::__cxx11::string::~string(local_890);
              lVar8 = std::__cxx11::string::find((char *)local_850,0x15b1fa);
            } while (lVar8 == 0);
            lVar8 = std::__cxx11::string::find(local_850,(ulong)local_600);
            if (lVar8 != -1) {
              bVar4 = true;
            }
          } while ((!bVar4) ||
                  (local_894 = std::__cxx11::string::find((char *)local_850,0x15c652),
                  local_894 == -1));
          std::__cxx11::string::substr((ulong)local_8b8,(ulong)local_850);
          std::__cxx11::string::operator=(local_850,local_8b8);
          std::__cxx11::string::~string(local_8b8);
          local_8bc = std::__cxx11::string::find((char *)local_850,0x15c0ba);
          if (local_8bc == -1) {
            std::operator+(local_960,(char *)err);
            std::operator+(local_940,local_960);
            std::operator+(local_920,(char *)local_940);
            std::__cxx11::to_string(local_980,local_82c);
            std::operator+(local_900,local_920);
            dVar14 = (double)std::operator+(local_8e0,(char *)local_900);
            log(dVar14);
            std::__cxx11::string::~string((string *)local_8e0);
            std::__cxx11::string::~string((string *)local_900);
            std::__cxx11::string::~string((string *)local_980);
            std::__cxx11::string::~string((string *)local_920);
            std::__cxx11::string::~string((string *)local_940);
            std::__cxx11::string::~string((string *)local_960);
LAB_00151668:
            bVar4 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)local_9c0,(ulong)local_850);
            trimSpaces(local_9a0);
            std::__cxx11::string::operator=(local_850,(string *)local_9a0);
            std::__cxx11::string::~string((string *)local_9a0);
            std::__cxx11::string::~string(local_9c0);
            lVar8 = std::__cxx11::string::find((char *)local_850,0x15b8aa);
            if (lVar8 == -1) {
              std::operator+(local_a60,(char *)err);
              std::operator+(local_a40,local_a60);
              std::operator+(local_a20,(char *)local_a40);
              std::__cxx11::to_string(local_a80,local_82c);
              std::operator+(local_a00,local_a20);
              dVar14 = (double)std::operator+(local_9e0,(char *)local_a00);
              log(dVar14);
              std::__cxx11::string::~string((string *)local_9e0);
              std::__cxx11::string::~string((string *)local_a00);
              std::__cxx11::string::~string((string *)local_a80);
              std::__cxx11::string::~string((string *)local_a20);
              std::__cxx11::string::~string((string *)local_a40);
              std::__cxx11::string::~string((string *)local_a60);
              goto LAB_00151668;
            }
            std::ifstream::close();
            readQuote(local_aa0);
            lVar8 = std::__cxx11::string::length();
            if (lVar8 != 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(__return_storage_ptr__,local_aa0);
            }
            bVar1 = true;
            bVar4 = true;
            std::__cxx11::string::~string((string *)local_aa0);
          }
          std::__cxx11::string::~string(local_850);
          if (!bVar4) goto LAB_0015169b;
        }
        std::ifstream::~ifstream(local_828);
        std::__cxx11::string::~string(local_600);
      }
      else {
        std::operator+(local_5e0,(char *)err);
        std::operator+(local_5c0,local_5e0);
        dVar14 = (double)std::operator+(local_5a0,(char *)local_5c0);
        log(dVar14);
        std::__cxx11::string::~string((string *)local_5a0);
        std::__cxx11::string::~string((string *)local_5c0);
        std::__cxx11::string::~string((string *)local_5e0);
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_560);
      goto LAB_00151f5d;
    }
    local_b01 = 1;
    for (local_b08 = 0; uVar9 = (ulong)local_b08, uVar13 = std::__cxx11::string::length(),
        uVar9 < uVar13; local_b08 = local_b08 + 1) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)arg);
      iVar5 = isalpha((int)*pcVar7);
      if (iVar5 == 0) {
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)arg);
        iVar5 = isdigit((int)*pcVar7);
        if (((iVar5 == 0) &&
            (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)arg), *pcVar7 != '_')) &&
           (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)arg), *pcVar7 != ':')) {
          local_b01 = 0;
          break;
        }
      }
    }
    if ((local_b01 & 1) == 0) {
      std::operator+(local_b68,(char *)err);
      std::operator+(local_b48,local_b68);
      dVar14 = (double)std::operator+(local_b28,(char *)local_b48);
      log(dVar14);
      std::__cxx11::string::~string((string *)local_b28);
      std::__cxx11::string::~string((string *)local_b48);
      std::__cxx11::string::~string((string *)local_b68);
      bVar1 = true;
      goto LAB_00151f5d;
    }
    lVar8 = std::__cxx11::string::find((char *)arg,0x15c714);
    if (lVar8 != -1) {
      std::__cxx11::string::find((char *)arg,0x15c714);
      std::__cxx11::string::substr((ulong)local_b88,(ulong)arg);
      std::__cxx11::string::operator=((string *)arg,local_b88);
      std::__cxx11::string::~string(local_b88);
    }
    std::ifstream::ifstream(local_d90,(string *)fname,_S_in);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
LAB_00151e3d:
      std::ifstream::close();
      std::operator+(local_ed8,(char *)err);
      std::operator+(local_eb8,local_ed8);
      dVar14 = (double)std::operator+(local_e98,(char *)local_eb8);
      log(dVar14);
      std::__cxx11::string::~string((string *)local_e98);
      std::__cxx11::string::~string((string *)local_eb8);
      std::__cxx11::string::~string((string *)local_ed8);
      bVar4 = false;
    }
    else {
      std::__cxx11::string::string(local_db8);
      do {
        do {
          do {
            do {
              piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  (local_d90,local_db8);
              bVar4 = std::ios::operator_cast_to_bool
                                ((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
              if (!bVar4) {
                bVar4 = false;
                goto LAB_00151e11;
              }
              std::__cxx11::string::string(local_df8,local_db8);
              trimSpaces(local_dd8);
              std::__cxx11::string::operator=(local_db8,(string *)local_dd8);
              std::__cxx11::string::~string((string *)local_dd8);
              std::__cxx11::string::~string(local_df8);
              lVar8 = std::__cxx11::string::find((char *)local_db8,0x15b1fa);
            } while ((lVar8 == 0) ||
                    (lVar8 = std::__cxx11::string::find(local_db8,(ulong)arg), lVar8 == -1));
            std::__cxx11::string::find(local_db8,(ulong)arg);
            std::__cxx11::string::length();
            std::__cxx11::string::substr((ulong)local_e18,(ulong)local_db8);
            std::__cxx11::string::operator=(local_db8,local_e18);
            std::__cxx11::string::~string(local_e18);
            lVar8 = std::__cxx11::string::find((char *)local_db8,0x15c5eb);
          } while (lVar8 == -1);
          std::__cxx11::string::find((char *)local_db8,0x15c5eb);
          std::__cxx11::string::substr((ulong)local_e38,(ulong)local_db8);
          std::__cxx11::string::operator=(local_db8,local_e38);
          std::__cxx11::string::~string(local_e38);
          lVar8 = std::__cxx11::string::find((char *)local_db8,0x15c0ba);
        } while (lVar8 == -1);
        std::__cxx11::string::find((char *)local_db8,0x15c0ba);
        std::__cxx11::string::substr((ulong)local_e58,(ulong)local_db8);
        std::__cxx11::string::operator=(local_db8,local_e58);
        std::__cxx11::string::~string(local_e58);
        lVar8 = std::__cxx11::string::find((char *)local_db8,0x15b8aa);
      } while (lVar8 == -1);
      std::ifstream::close();
      readQuote(local_e78);
      lVar8 = std::__cxx11::string::length();
      if (lVar8 != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,local_e78);
      }
      bVar1 = true;
      bVar4 = true;
      std::__cxx11::string::~string((string *)local_e78);
LAB_00151e11:
      std::__cxx11::string::~string(local_db8);
      if (!bVar4) goto LAB_00151e3d;
    }
    std::ifstream::~ifstream(local_d90);
    if (bVar4) goto LAB_00151f5d;
  }
  else {
    iVar5 = std::__cxx11::string::find((char *)arg,0x15b415);
    iVar6 = std::__cxx11::string::find((char *)arg,0x15ba94);
    std::__cxx11::string::substr((ulong)local_b0,(ulong)arg);
    trimSpaces(local_90);
    std::__cxx11::string::~string(local_b0);
    if ((iVar6 == iVar5 + 1) || (lVar8 = std::__cxx11::string::length(), lVar8 == 0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     (char *)err);
      std::operator+(local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &idx);
      dVar14 = (double)std::operator+(local_d0,(char *)local_f0);
      log(dVar14);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)&idx);
      bVar1 = true;
      bVar4 = true;
    }
    else {
      bVar4 = true;
      local_118 = -1;
      for (local_11c = 0; uVar9 = std::__cxx11::string::size(), (ulong)(long)local_11c < uVar9;
          local_11c = local_11c + 1) {
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
        iVar5 = isdigit((int)*pcVar7);
        if (iVar5 == 0) {
          bVar4 = false;
        }
      }
      if (bVar4) {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        local_118 = atoi(pcVar7);
      }
      std::__cxx11::string::find((char *)arg,0x15b415);
      std::__cxx11::string::substr
                ((ulong)&arr.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)arg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_158);
      std::ifstream::ifstream(local_360,(string *)fname,_S_in);
      bVar2 = std::ifstream::is_open();
      if ((bVar2 & 1) != 0) {
        bVar4 = false;
        std::__cxx11::string::string(local_388);
LAB_00150569:
        do {
          do {
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                (local_360,local_388);
            bVar3 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
            if (!bVar3) goto LAB_00150ab4;
            std::__cxx11::string::string(local_3c8,local_388);
            trimSpaces(local_3a8);
            std::__cxx11::string::operator=(local_388,(string *)local_3a8);
            std::__cxx11::string::~string((string *)local_3a8);
            std::__cxx11::string::~string(local_3c8);
            lVar8 = std::__cxx11::string::find((char *)local_388,0x15b1fa);
          } while (lVar8 == 0);
          if (!bVar4) {
            lVar8 = std::__cxx11::string::find
                              (local_388,
                               (ulong)&arr.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (lVar8 == -1) goto LAB_00150569;
            std::__cxx11::string::find
                      (local_388,
                       (ulong)&arr.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::length();
            std::__cxx11::string::substr((ulong)local_3e8,(ulong)local_388);
            std::__cxx11::string::operator=(local_388,local_3e8);
            std::__cxx11::string::~string(local_3e8);
            lVar8 = std::__cxx11::string::find((char *)local_388,0x15c5eb);
            if (lVar8 == -1) goto LAB_00150569;
            std::__cxx11::string::find((char *)local_388,0x15c5eb);
            std::__cxx11::string::substr((ulong)local_408,(ulong)local_388);
            std::__cxx11::string::operator=(local_388,local_408);
            std::__cxx11::string::~string(local_408);
            lVar8 = std::__cxx11::string::find((char *)local_388,0x15c26b);
            if (lVar8 == -1) {
              std::__cxx11::string::find((char *)local_388,0x15c26b);
              std::__cxx11::string::substr((ulong)local_428,(ulong)local_388);
              std::__cxx11::string::operator=(local_388,local_428);
              std::__cxx11::string::~string(local_428);
            }
            bVar4 = true;
          }
          if (!bVar4) goto LAB_00150569;
          lVar8 = std::__cxx11::string::find((char *)local_388,0x15c26b);
          if (lVar8 == -1) {
            std::__cxx11::string::find((char *)local_388,0x15c26b);
            std::__cxx11::string::substr((ulong)local_448,(ulong)local_388);
            std::__cxx11::string::operator=(local_388,local_448);
            std::__cxx11::string::~string(local_448);
          }
          do {
            readQuote(local_470);
            lVar8 = std::__cxx11::string::length();
            if (lVar8 != 0) {
              std::__cxx11::string::find((char *)local_388,0x15b8aa);
              std::__cxx11::string::substr((ulong)local_490,(ulong)local_388);
              std::__cxx11::string::operator=(local_388,local_490);
              std::__cxx11::string::~string(local_490);
              std::__cxx11::string::find((char *)local_388,0x15b8aa);
              std::__cxx11::string::substr((ulong)local_4b0,(ulong)local_388);
              std::__cxx11::string::operator=(local_388,local_4b0);
              std::__cxx11::string::~string(local_4b0);
              std::__cxx11::string::find((char *)local_388,0x15c590);
              std::__cxx11::string::substr((ulong)local_4d0,(ulong)local_388);
              std::__cxx11::string::operator=(local_388,local_4d0);
              std::__cxx11::string::~string(local_4d0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_158,local_470);
            }
            std::__cxx11::string::~string((string *)local_470);
          } while (lVar8 != 0);
          lVar8 = std::__cxx11::string::find((char *)local_388,0x15c0ba);
        } while (lVar8 == -1);
LAB_00150ab4:
        std::__cxx11::string::~string(local_388);
      }
      std::ifstream::close();
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_158);
      if (sVar11 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&close_1
                       ,(char *)err);
        std::operator+(local_518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&close_1
                      );
        dVar14 = (double)std::operator+(local_4f8,(char *)local_518);
        log(dVar14);
        std::__cxx11::string::~string((string *)local_4f8);
        std::__cxx11::string::~string((string *)local_518);
        std::__cxx11::string::~string((string *)&close_1);
        bVar4 = false;
      }
      else {
        sVar11 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_158);
        if ((ulong)(long)local_118 < sVar11) {
          pvVar12 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_158,(long)local_118);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,pvVar12);
          bVar1 = true;
          bVar4 = true;
        }
        else {
          for (local_4d4 = 0; uVar9 = (ulong)local_4d4,
              sVar11 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_158), uVar9 < sVar11; local_4d4 = local_4d4 + 1) {
            pvVar12 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_158,(long)local_4d4);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,pvVar12);
          }
          bVar1 = true;
          bVar4 = true;
        }
      }
      std::ifstream::~ifstream(local_360);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_158);
      std::__cxx11::string::~string
                ((string *)
                 &arr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::string::~string((string *)local_90);
    if (bVar4) goto LAB_00151f5d;
  }
  bVar1 = true;
LAB_00151f5d:
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> parse_script_arg(string arg, string fname, string err)
{
	vector<string> ret;

	// parse weapon name from argument 1
	if (arg[0] == '"')
	{
		// It's a string. Easy!
		string val = readQuote(arg);
		if (val.length())
			ret.push_back(val);
		return ret;
	}
	else if (arg.find("[") != string::npos)
	{
		// an index into an array
		int open = arg.find("[");
		int close = arg.find("]");
		string index = trimSpaces(arg.substr(open, close));
		if (close == open+1 || index.length() == 0)
		{
			log(err + "\t Reason: array index couldn't be parsed from '" + arg + "'\n");
			return ret;
		}
		
		bool isNumber = true;
		int idx = -1;
		for (int i = 0; i < index.size(); i++)
			if (!isdigit(index[i]))
				isNumber = false;
		if (isNumber)
			idx = atoi(index.c_str());
		
		// Parse file for array definition
		string def = arg.substr(0, arg.find("["));
		vector<string> arr;
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_array = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (!in_array)
				{
					if (line.find(def) == string::npos)
						continue;
					line = line.substr(line.find(def) + def.length());

					if (line.find("=") == string::npos)
						continue;
					line = line.substr(line.find("=") + 1);

					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					in_array = true;
				}
				if (in_array)
				{
					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					bool hasQuote = true;
					while(hasQuote)
					{
						string element = readQuote(line);
						if (element.length())
						{
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find(",") + 1);
							arr.push_back(element);
						}
						else
							break;
					}

					if (line.find(";") != string::npos)
						break;
				}
				
			}
		}
		file.close();

		if (arr.size() > 0)
		{
			if (idx >= arr.size())
			{
				for (int i = 0; i < arr.size(); i++)
					ret.push_back(arr[i]);
				return ret;
			}
			else
			{
				ret.push_back(arr[idx]);
				return ret;
			}
		}

		log(err + "\t Reason: Failed to parse array definition for '" + arg + "\n");
	}
	else if (arg.find("(") != string::npos && arg.find(")") != string::npos)
	{
		// Uh oh. It's a function
		int open = arg.find("(");
		int close = arg.find(")");
		string params = trimSpaces(arg.substr(open, close));
		if (close != open+1 && params.length())
		{
			log(err + "\t Reason: function call '" + arg + "' has parameters\n");
			return ret;
		}
					
		string funcdef = "string " + arg.substr(0, arg.find("(") + 1);

		// Parse file for function definition
		// anything more complicated than { return "weapon_super"; } won't work
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_func_body = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(funcdef) != string::npos)
					in_func_body = true;

				if (in_func_body)
				{
					int iret = line.find("return ");
					if (iret != string::npos)
					{
						line = line.substr(iret);
						int semi = line.find(";");
						if (semi == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						line = trimSpaces(line.substr(0, semi));
						if (line.find("\"") == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						file.close();

						string val = readQuote(line);
						if (val.length())
							ret.push_back(val);
						return ret;
					}
				}
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse function definition for '" + arg + "\n");
		return ret;
	}
	else // must be a variable
	{
		bool valid_var_name = true;
		for (int i = 0; i < arg.length(); i++)
		{
			if (!isalpha(arg[i]) && !isdigit(arg[i]) && arg[i] != '_' && arg[i] != ':')
			{
				valid_var_name = false;
				break;
			}
		}
		if (!valid_var_name)
		{
			log(err + "\t Reason: argument '" + arg + "' does not appear to be a string, variable, or function\n");
			return ret;
		}
		
		// Strip namespace from the variable name.
		// This will break if there's a different var with the same name assigned in the same file.
		// Ideally all scripts should be searched and the namespace should only be removed when
		// inside the namespace block. Anyway this is good enough for ressya_no_tabi.
		if (arg.find("::") != string::npos) {
			arg = arg.substr(arg.find("::")+2);
		}

		// Parse file for variable assignment
		// ...hopefully it's a global assigned at the top of the file
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(arg) == string::npos)
					continue;
				line = line.substr(line.find(arg) + arg.length());

				if (line.find("=") == string::npos)
					continue;
				line = line.substr(line.find("=") + 1);

				if (line.find(";") == string::npos)
					continue;
				line = line.substr(0, line.find(";"));

				if (line.find("\"") == string::npos)
					continue;

				file.close();

				string val = readQuote(line);
				if (val.length())
					ret.push_back(val);
				return ret;
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse variable assignment for '" + arg + "\n");
	}

	return ret;
}